

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::shader_requires_feature(Converter *this,ShaderFeature feature)

{
  bool bVar1;
  pointer pIVar2;
  Builder *pBVar3;
  undefined1 local_29;
  ShaderFeature feature_local;
  Converter *this_local;
  
  if (feature == Native16BitOperations) {
    pIVar2 = std::
             unique_ptr<dxil_spv::Converter::Impl,_std::default_delete<dxil_spv::Converter::Impl>_>
             ::operator->(&this->impl);
    pBVar3 = Impl::builder(pIVar2);
    bVar1 = spv::Builder::hasCapability(pBVar3,CapabilityFloat16);
    local_29 = true;
    if (!bVar1) {
      pIVar2 = std::
               unique_ptr<dxil_spv::Converter::Impl,_std::default_delete<dxil_spv::Converter::Impl>_>
               ::operator->(&this->impl);
      pBVar3 = Impl::builder(pIVar2);
      local_29 = spv::Builder::hasCapability(pBVar3,CapabilityInt16);
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Converter::shader_requires_feature(ShaderFeature feature) const
{
	switch (feature)
	{
	case ShaderFeature::Native16BitOperations:
		return impl->builder().hasCapability(spv::CapabilityFloat16) ||
		       impl->builder().hasCapability(spv::CapabilityInt16);

	default:
		return false;
	}
}